

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t terminal_gettc(EditLine *el,wchar_t argc,char **argv)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  if (((argv != (char **)0x0) && (pcVar4 = argv[1], pcVar4 != (char *)0x0)) &&
     (pwVar2 = (wchar_t *)argv[2], pwVar2 != (wchar_t *)0x0)) {
    pcVar6 = "al";
    lVar7 = 0;
    do {
      iVar3 = strcmp(pcVar6,pcVar4);
      if (iVar3 == 0) {
        *(undefined8 *)pwVar2 = *(undefined8 *)((long)(el->el_terminal).t_str + (lVar7 >> 1));
        return L'\0';
      }
      pcVar6 = *(char **)((long)&tstr[1].name + lVar7);
      lVar7 = lVar7 + 0x10;
    } while (pcVar6 != (char *)0x0);
    pcVar6 = "am";
    lVar7 = 0;
    uVar5 = 0;
    do {
      iVar3 = strcmp(pcVar6,pcVar4);
      if (iVar3 == 0) {
        wVar1 = (el->el_terminal).t_val[lVar7];
        if (uVar5 < 0x20 || (uVar5 & 0x7fffffffffffffd0) == 0x40) {
          pcVar4 = terminal_gettc::yes;
          if (wVar1 == L'\0') {
            pcVar4 = terminal_gettc::no;
          }
          *(char **)pwVar2 = pcVar4;
        }
        else {
          *pwVar2 = wVar1;
        }
        return L'\0';
      }
      pcVar6 = *(char **)((long)&tval[1].name + uVar5);
      uVar5 = uVar5 + 0x10;
      lVar7 = lVar7 + 1;
    } while (pcVar6 != (char *)0x0);
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_gettc(EditLine *el, int argc __attribute__((__unused__)), char **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char *what;
	void *how;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	what = argv[1];
	how = argv[2];

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		*(char **)how = el->el_terminal.t_str[ts - tstr];
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL)
		return -1;

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		static char yes[] = "yes";
		static char no[] = "no";
		if (el->el_terminal.t_val[tv - tval])
			*(char **)how = yes;
		else
			*(char **)how = no;
		return 0;
	} else {
		*(int *)how = el->el_terminal.t_val[tv - tval];
		return 0;
	}
}